

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O2

int __thiscall SocketOnline::recv_message_int(SocketOnline *this)

{
  int iVar1;
  char *p;
  
  recv_message_n(this,this->sock,this->buffer,4);
  p = this->buffer;
  iVar1 = Constant::Util::char_to_int(&p);
  return iVar1;
}

Assistant:

int SocketOnline::recv_message_int() {
    recv_message_n(sock, buffer, 4);
    char* p = buffer;
    int ret = Constant::Util::char_to_int(p);
    return ret;
}